

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int ncnn::reduction_op_keepdims<ncnn::reduction_op_sumsexp<float>,ncnn::reduction_op_add<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  reduction_op_sumsexp<float> *this;
  byte in_CL;
  byte in_DL;
  Mat *in_RSI;
  Mat *in_RDI;
  byte in_R8B;
  float in_XMM0_Da;
  float fVar3;
  int j_7;
  int i_13;
  float *outptr_2;
  float *ptr_10;
  int q_8;
  int i_12;
  float *ptr_9;
  int q_7;
  int j_6;
  float *mins_ptr_3;
  int q_6;
  int j_5;
  int i_11;
  float *mins_ptr_2;
  float *ptr_8;
  int q_5;
  Mat mins_1;
  int i_10;
  float *mins_ptr_1;
  int q_4;
  int j_4;
  float sum_8;
  int i_9;
  float *mins_ptr;
  float *ptr_7;
  int q_3;
  Mat mins;
  int j_3;
  float sum_7;
  int i_8;
  float *outptr_1;
  float *ptr_6;
  int q_2;
  int i_7;
  float sum_6;
  float *outptr;
  float *ptr_5;
  int q_1;
  int i_6;
  float sum_4;
  int i_5;
  float sum_5;
  float *ptr_4;
  int q;
  Mat sums_1;
  int size;
  int channels;
  int h_1;
  int w_2;
  int j_2;
  float *ptr_3;
  int i_4;
  int j_1;
  float sum_3;
  float *ptr_2;
  int i_3;
  int i_2;
  float sum_1;
  int j;
  float sum_2;
  float *ptr_1;
  int i_1;
  Mat sums;
  int h;
  int w_1;
  int i;
  float sum;
  float *ptr;
  int w;
  int dims;
  size_t elemsize;
  reduction_op_add<float> op2;
  reduction_op_sumsexp<float> op;
  Allocator *in_stack_fffffffffffff818;
  Mat *in_stack_fffffffffffff820;
  int in_stack_fffffffffffff828;
  float in_stack_fffffffffffff82c;
  Mat *in_stack_fffffffffffff830;
  int _c;
  int in_stack_fffffffffffff838;
  int in_stack_fffffffffffff83c;
  Mat *in_stack_fffffffffffff840;
  undefined4 in_stack_fffffffffffff848;
  float in_stack_fffffffffffff84c;
  int local_6d8;
  int local_6d4;
  Mat local_6d0;
  float *local_688;
  Mat local_680;
  float *local_638;
  int local_630;
  int local_62c;
  Mat local_628;
  reduction_op_sumsexp<float> *local_5e0;
  int local_5d8;
  int local_5d4;
  Mat local_5d0;
  Mat *local_588;
  int local_57c;
  int local_578;
  int local_574;
  Mat local_570;
  float *local_528;
  Mat local_520;
  float *local_4d8;
  int local_4cc;
  int local_47c;
  Mat local_478;
  float *local_430;
  int local_428;
  int local_424;
  float local_420;
  int local_41c;
  Mat local_418;
  float *local_3d0;
  Mat local_3c8;
  float *local_380;
  int local_374;
  int local_324;
  float local_320;
  int local_31c;
  Mat local_318;
  float *local_2d0;
  Mat local_2c8;
  float *local_280;
  int local_274;
  int local_270;
  float local_26c;
  Mat local_268;
  float *local_220;
  Mat local_218;
  float *local_1d0;
  int local_1c4;
  int local_1c0;
  float local_1bc;
  int local_1b8;
  float local_1b4;
  Mat local_1b0;
  float *local_168;
  int local_15c;
  Mat local_158;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  float *local_f8;
  int local_ec;
  int local_e8;
  float local_e4;
  float *local_e0;
  int local_d4;
  int local_d0;
  float local_cc;
  int local_c8;
  float local_c4;
  float *local_c0;
  int local_b4;
  undefined4 local_b0;
  Mat local_a0;
  int local_58;
  int local_54;
  int local_50;
  float local_4c;
  float *local_48;
  int local_40;
  int local_3c;
  size_t local_38;
  reduction_op_add<float> local_2a [11];
  byte local_1f;
  byte local_1e;
  byte local_1d;
  float local_1c;
  Mat *local_18;
  Mat *local_10;
  int local_4;
  
  local_1d = in_DL & 1;
  local_1e = in_CL & 1;
  local_1f = in_R8B & 1;
  local_38 = in_RDI->elemsize;
  local_3c = in_RDI->dims;
  local_1c = in_XMM0_Da;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (local_3c == 1) {
    local_40 = in_RDI->w;
    Mat::create(in_stack_fffffffffffff840,in_stack_fffffffffffff83c,
                (size_t)in_stack_fffffffffffff830,
                (Allocator *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
    local_48 = Mat::operator_cast_to_float_(local_10);
    local_4c = local_1c;
    for (local_50 = 0; fVar3 = local_4c, local_50 < local_40; local_50 = local_50 + 1) {
      local_4c = reduction_op_sumsexp<float>::operator()
                           ((reduction_op_sumsexp<float> *)in_stack_fffffffffffff830,
                            (float *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                            (float *)in_stack_fffffffffffff820);
    }
    pfVar2 = Mat::operator[](local_18,0);
    *pfVar2 = fVar3;
    return 0;
  }
  if (local_3c == 2) {
    local_54 = in_RDI->w;
    local_58 = in_RDI->h;
    if ((local_1d != 0) && (local_1e != 0)) {
      Mat::create(in_stack_fffffffffffff840,in_stack_fffffffffffff83c,in_stack_fffffffffffff838,
                  (size_t)in_stack_fffffffffffff830,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
      Mat::Mat(in_stack_fffffffffffff830,(int)in_stack_fffffffffffff82c,
               (size_t)in_stack_fffffffffffff820,in_stack_fffffffffffff818);
      bVar1 = Mat::empty(in_stack_fffffffffffff820);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        for (local_b4 = 0; local_b4 < local_58; local_b4 = local_b4 + 1) {
          local_c0 = Mat::row(local_10,local_b4);
          local_c4 = local_1c;
          for (local_c8 = 0; fVar3 = local_c4, local_c8 < local_54; local_c8 = local_c8 + 1) {
            local_c4 = reduction_op_sumsexp<float>::operator()
                                 ((reduction_op_sumsexp<float> *)in_stack_fffffffffffff830,
                                  (float *)CONCAT44(in_stack_fffffffffffff82c,
                                                    in_stack_fffffffffffff828),
                                  (float *)in_stack_fffffffffffff820);
          }
          pfVar2 = Mat::operator[](&local_a0,(long)local_b4);
          *pfVar2 = fVar3;
        }
        local_cc = local_1c;
        for (local_d0 = 0; fVar3 = local_cc, local_d0 < local_58; local_d0 = local_d0 + 1) {
          pfVar2 = Mat::operator[](&local_a0,(long)local_d0);
          local_cc = reduction_op_add<float>::operator()(local_2a,&local_cc,pfVar2);
        }
        pfVar2 = Mat::operator[](local_18,0);
        *pfVar2 = fVar3;
        local_4 = 0;
      }
      local_b0 = 1;
      Mat::~Mat((Mat *)0x520abc);
      return local_4;
    }
    if ((local_1d != 0) && (local_1e == 0)) {
      Mat::create(in_stack_fffffffffffff840,in_stack_fffffffffffff83c,in_stack_fffffffffffff838,
                  (size_t)in_stack_fffffffffffff830,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
      for (local_d4 = 0; local_d4 < local_58; local_d4 = local_d4 + 1) {
        local_e0 = Mat::row(local_10,local_d4);
        local_e4 = local_1c;
        for (local_e8 = 0; fVar3 = local_e4, local_e8 < local_54; local_e8 = local_e8 + 1) {
          local_e4 = reduction_op_sumsexp<float>::operator()
                               ((reduction_op_sumsexp<float> *)in_stack_fffffffffffff830,
                                (float *)CONCAT44(in_stack_fffffffffffff82c,
                                                  in_stack_fffffffffffff828),
                                (float *)in_stack_fffffffffffff820);
        }
        pfVar2 = Mat::operator[](local_18,(long)local_d4);
        *pfVar2 = fVar3;
      }
      return 0;
    }
    if ((local_1d == 0) && (local_1e != 0)) {
      Mat::create(in_stack_fffffffffffff840,in_stack_fffffffffffff83c,in_stack_fffffffffffff838,
                  (size_t)in_stack_fffffffffffff830,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
      Mat::fill(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
      for (local_ec = 0; local_ec < local_58; local_ec = local_ec + 1) {
        local_f8 = Mat::row(local_10,local_ec);
        for (local_fc = 0; local_fc < local_54; local_fc = local_fc + 1) {
          Mat::operator[](local_18,(long)local_fc);
          fVar3 = reduction_op_sumsexp<float>::operator()
                            ((reduction_op_sumsexp<float> *)in_stack_fffffffffffff830,
                             (float *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                             (float *)in_stack_fffffffffffff820);
          pfVar2 = Mat::operator[](local_18,(long)local_fc);
          *pfVar2 = fVar3;
        }
      }
      return 0;
    }
  }
  if (local_3c == 3) {
    local_100 = in_RDI->w;
    local_104 = in_RDI->h;
    local_108 = in_RDI->c;
    local_10c = local_100 * local_104;
    _c = (int)((ulong)in_stack_fffffffffffff830 >> 0x20);
    if (((local_1d != 0) && (local_1e != 0)) && (local_1f != 0)) {
      Mat::create(in_stack_fffffffffffff840,in_stack_fffffffffffff83c,in_stack_fffffffffffff838,_c,
                  CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                  (Allocator *)in_stack_fffffffffffff820);
      Mat::Mat(in_stack_fffffffffffff830,(int)in_stack_fffffffffffff82c,
               (size_t)in_stack_fffffffffffff820,in_stack_fffffffffffff818);
      bVar1 = Mat::empty(in_stack_fffffffffffff820);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        for (local_15c = 0; local_15c < local_108; local_15c = local_15c + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                       (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_1b0);
          Mat::~Mat((Mat *)0x520f11);
          local_1b4 = local_1c;
          local_168 = pfVar2;
          for (local_1b8 = 0; fVar3 = local_1b4, local_1b8 < local_10c; local_1b8 = local_1b8 + 1) {
            local_1b4 = reduction_op_sumsexp<float>::operator()
                                  ((reduction_op_sumsexp<float> *)in_stack_fffffffffffff830,
                                   (float *)CONCAT44(in_stack_fffffffffffff82c,
                                                     in_stack_fffffffffffff828),
                                   (float *)in_stack_fffffffffffff820);
          }
          pfVar2 = Mat::operator[](&local_158,(long)local_15c);
          *pfVar2 = fVar3;
        }
        local_1bc = local_1c;
        for (local_1c0 = 0; fVar3 = local_1bc, local_1c0 < local_108; local_1c0 = local_1c0 + 1) {
          pfVar2 = Mat::operator[](&local_158,(long)local_1c0);
          local_1bc = reduction_op_add<float>::operator()(local_2a,&local_1bc,pfVar2);
        }
        pfVar2 = Mat::operator[](local_18,0);
        *pfVar2 = fVar3;
        local_4 = 0;
      }
      local_b0 = 1;
      Mat::~Mat((Mat *)0x5210ba);
      return local_4;
    }
    if (((local_1d != 0) && (local_1e != 0)) && (local_1f == 0)) {
      Mat::create(in_stack_fffffffffffff840,in_stack_fffffffffffff83c,in_stack_fffffffffffff838,_c,
                  CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                  (Allocator *)in_stack_fffffffffffff820);
      for (local_1c4 = 0; local_1c4 < local_108; local_1c4 = local_1c4 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                     (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_218);
        Mat::~Mat((Mat *)0x521175);
        local_1d0 = pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                     (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_268);
        Mat::~Mat((Mat *)0x5211c3);
        local_26c = local_1c;
        local_220 = pfVar2;
        for (local_270 = 0; local_270 < local_10c; local_270 = local_270 + 1) {
          local_26c = reduction_op_sumsexp<float>::operator()
                                ((reduction_op_sumsexp<float> *)in_stack_fffffffffffff830,
                                 (float *)CONCAT44(in_stack_fffffffffffff82c,
                                                   in_stack_fffffffffffff828),
                                 (float *)in_stack_fffffffffffff820);
        }
        *local_220 = local_26c;
      }
      return 0;
    }
    if (((local_1d != 0) && (local_1e == 0)) && (local_1f == 0)) {
      Mat::create(in_stack_fffffffffffff840,in_stack_fffffffffffff83c,in_stack_fffffffffffff838,_c,
                  CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                  (Allocator *)in_stack_fffffffffffff820);
      for (local_274 = 0; local_274 < local_108; local_274 = local_274 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                     (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_2c8);
        Mat::~Mat((Mat *)0x52133e);
        local_280 = pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                     (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_318);
        Mat::~Mat((Mat *)0x52138c);
        local_2d0 = pfVar2;
        for (local_31c = 0; local_31c < local_104; local_31c = local_31c + 1) {
          local_320 = local_1c;
          for (local_324 = 0; local_324 < local_100; local_324 = local_324 + 1) {
            local_320 = reduction_op_sumsexp<float>::operator()
                                  ((reduction_op_sumsexp<float> *)in_stack_fffffffffffff830,
                                   (float *)CONCAT44(in_stack_fffffffffffff82c,
                                                     in_stack_fffffffffffff828),
                                   (float *)in_stack_fffffffffffff820);
          }
          local_2d0[local_31c] = local_320;
          local_280 = local_280 + local_100;
        }
      }
      return 0;
    }
    if (((local_1d != 0) && (local_1e == 0)) && (local_1f != 0)) {
      Mat::create(in_stack_fffffffffffff840,in_stack_fffffffffffff83c,in_stack_fffffffffffff838,_c,
                  CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                  (Allocator *)in_stack_fffffffffffff820);
      Mat::Mat(in_stack_fffffffffffff830,(int)in_stack_fffffffffffff82c,in_stack_fffffffffffff828,
               (int)((ulong)in_stack_fffffffffffff820 >> 0x20),(size_t)in_stack_fffffffffffff818,
               (Allocator *)0x52154b);
      bVar1 = Mat::empty(in_stack_fffffffffffff820);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        Mat::fill(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
        for (local_374 = 0; local_374 < local_108; local_374 = local_374 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                       (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_3c8);
          Mat::~Mat((Mat *)0x52162c);
          local_380 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                       (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_418);
          Mat::~Mat((Mat *)0x521679);
          local_3d0 = pfVar2;
          for (local_41c = 0; local_41c < local_104; local_41c = local_41c + 1) {
            local_420 = local_1c;
            for (local_424 = 0; local_424 < local_100; local_424 = local_424 + 1) {
              local_420 = reduction_op_sumsexp<float>::operator()
                                    ((reduction_op_sumsexp<float> *)in_stack_fffffffffffff830,
                                     (float *)CONCAT44(in_stack_fffffffffffff82c,
                                                       in_stack_fffffffffffff828),
                                     (float *)in_stack_fffffffffffff820);
            }
            local_3d0[local_41c] = local_420;
            local_380 = local_380 + local_100;
          }
        }
        Mat::fill(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
        for (local_428 = 0; local_428 < local_108; local_428 = local_428 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                       (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_478);
          Mat::~Mat((Mat *)0x521804);
          local_430 = pfVar2;
          for (local_47c = 0; local_47c < local_104; local_47c = local_47c + 1) {
            pfVar2 = Mat::operator[](local_18,(long)local_47c);
            fVar3 = reduction_op_add<float>::operator()(local_2a,pfVar2,local_430 + local_47c);
            pfVar2 = Mat::operator[](local_18,(long)local_47c);
            *pfVar2 = fVar3;
          }
        }
        local_4 = 0;
      }
      local_b0 = 1;
      Mat::~Mat((Mat *)0x5218de);
      return local_4;
    }
    if (((local_1d == 0) && (local_1e != 0)) && (local_1f != 0)) {
      Mat::create(in_stack_fffffffffffff840,in_stack_fffffffffffff83c,in_stack_fffffffffffff838,_c,
                  CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                  (Allocator *)in_stack_fffffffffffff820);
      Mat::Mat(in_stack_fffffffffffff830,(int)in_stack_fffffffffffff82c,in_stack_fffffffffffff828,
               (int)((ulong)in_stack_fffffffffffff820 >> 0x20),(size_t)in_stack_fffffffffffff818,
               (Allocator *)0x521978);
      bVar1 = Mat::empty(in_stack_fffffffffffff820);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        Mat::fill(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
        for (local_4cc = 0; local_4cc < local_108; local_4cc = local_4cc + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                       (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_520);
          Mat::~Mat((Mat *)0x521a47);
          local_4d8 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                       (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_570);
          Mat::~Mat((Mat *)0x521a91);
          local_528 = pfVar2;
          for (local_574 = 0; local_574 < local_104; local_574 = local_574 + 1) {
            for (local_578 = 0; local_578 < local_100; local_578 = local_578 + 1) {
              in_stack_fffffffffffff84c =
                   reduction_op_sumsexp<float>::operator()
                             ((reduction_op_sumsexp<float> *)in_stack_fffffffffffff830,
                              (float *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828)
                              ,(float *)in_stack_fffffffffffff820);
              local_528[local_578] = in_stack_fffffffffffff84c;
            }
            local_4d8 = local_4d8 + local_100;
          }
        }
        Mat::fill(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
        for (local_57c = 0; local_57c < local_108; local_57c = local_57c + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                       (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
          in_stack_fffffffffffff840 = (Mat *)Mat::operator_cast_to_float_(&local_5d0);
          Mat::~Mat((Mat *)0x521bfc);
          local_588 = in_stack_fffffffffffff840;
          for (local_5d4 = 0; local_5d4 < local_100; local_5d4 = local_5d4 + 1) {
            pfVar2 = Mat::operator[](local_18,(long)local_5d4);
            fVar3 = reduction_op_add<float>::operator()
                              (local_2a,pfVar2,
                               (float *)((long)&local_588->data + (long)local_5d4 * 4));
            pfVar2 = Mat::operator[](local_18,(long)local_5d4);
            *pfVar2 = fVar3;
          }
        }
        local_4 = 0;
      }
      local_b0 = 1;
      Mat::~Mat((Mat *)0x521cd6);
      return local_4;
    }
    if (((local_1d == 0) && (local_1e == 0)) && (local_1f != 0)) {
      Mat::create(in_stack_fffffffffffff840,in_stack_fffffffffffff83c,in_stack_fffffffffffff838,_c,
                  CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                  (Allocator *)in_stack_fffffffffffff820);
      Mat::fill(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
      for (local_5d8 = 0; local_5d8 < local_108; local_5d8 = local_5d8 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                     (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
        this = (reduction_op_sumsexp<float> *)Mat::operator_cast_to_float_(&local_628);
        Mat::~Mat((Mat *)0x521da9);
        local_5e0 = this;
        for (local_62c = 0; local_62c < local_10c; local_62c = local_62c + 1) {
          Mat::operator[](local_18,(long)local_62c);
          in_stack_fffffffffffff82c =
               reduction_op_sumsexp<float>::operator()
                         (this,(float *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828
                                                ),(float *)in_stack_fffffffffffff820);
          pfVar2 = Mat::operator[](local_18,(long)local_62c);
          *pfVar2 = in_stack_fffffffffffff82c;
        }
      }
      return 0;
    }
    if (((local_1d == 0) && (local_1e != 0)) && (local_1f == 0)) {
      Mat::create(in_stack_fffffffffffff840,in_stack_fffffffffffff83c,in_stack_fffffffffffff838,_c,
                  CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                  (Allocator *)in_stack_fffffffffffff820);
      Mat::fill(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
      for (local_630 = 0; local_630 < local_108; local_630 = local_630 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                     (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_680);
        Mat::~Mat((Mat *)0x521f3d);
        local_638 = pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                     (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_6d0);
        Mat::~Mat((Mat *)0x521f84);
        local_688 = pfVar2;
        for (local_6d4 = 0; local_6d4 < local_104; local_6d4 = local_6d4 + 1) {
          for (local_6d8 = 0; local_6d8 < local_100; local_6d8 = local_6d8 + 1) {
            fVar3 = reduction_op_sumsexp<float>::operator()
                              ((reduction_op_sumsexp<float> *)in_stack_fffffffffffff830,
                               (float *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828
                                                ),pfVar2);
            local_688[local_6d8] = fVar3;
          }
          local_638 = local_638 + local_100;
        }
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

static int reduction_op_keepdims(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i = 0; i < w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> 1 1
            b.create(1, 1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i = 0; i < h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> 1 h
            b.create(1, h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }

            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w 1
            b.create(w, 1, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }

            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> 1 1 1
            b.create(1, 1, 1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i = 0; i < channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> 1 1 c
            b.create(1, 1, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[0] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> 1 h c
            b.create(1, h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> 1 h 1
            b.create(1, h, 1, elemsize, opt.blob_allocator);

            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i = 0; i < h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w 1 1
            b.create(w, 1, 1, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h 1
            b.create(w, h, 1, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i = 0; i < size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w 1 c
            b.create(w, 1, channels, elemsize, opt.blob_allocator);
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            return 0;
        }
    }

    return 0;
}